

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O3

vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
wallet::ListDatabases_abi_cxx11_
          (vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,wallet *this,path *wallet_dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  char cVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  path *ppVar9;
  path *ppVar10;
  long lVar11;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  undefined1 auVar12 [16];
  Level level;
  char (*in_stack_fffffffffffffd88) [14];
  recursive_directory_iterator it;
  error_code ec;
  path local_218;
  path local_1f0;
  path local_1c8;
  path local_1a0;
  path local_178;
  path local_150;
  path local_128;
  path local_100;
  path local_d8;
  path local_b0;
  path path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            (&it,(path *)this,none,&ec);
  paVar1 = &local_150._M_pathname.field_2;
  do {
    _Var4._M_pi = it._M_dirs._M_refcount._M_pi;
    path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
    path.super_path._M_pathname._M_string_length = 0;
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)&path.super_path);
    if (_Var4._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&it);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (vector<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<fs::path,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__;
    }
    if (ec._M_value == 0) {
      std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
      std::filesystem::__cxx11::path::lexically_relative(&local_100);
      std::filesystem::__cxx11::path::path(&path.super_path,&local_100);
      std::filesystem::__cxx11::path::~path(&local_100);
      ppVar9 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
      cVar5 = std::filesystem::status(ppVar9);
      if (cVar5 == '\x02') {
        ppVar9 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
        std::filesystem::__cxx11::path::path(&local_178,ppVar9);
        std::filesystem::__cxx11::path::path(&local_150,&local_178);
        BDBDataFile((path *)&local_128,(path *)&local_150);
        bVar6 = IsBDBFile((path *)&local_128);
        std::filesystem::__cxx11::path::~path(&local_128);
        std::filesystem::__cxx11::path::~path(&local_150);
        std::filesystem::__cxx11::path::~path(&local_178);
        if (!bVar6) {
          ppVar9 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
          std::filesystem::__cxx11::path::path(&local_1a0,ppVar9);
          std::filesystem::__cxx11::path::path(&local_150,&local_1a0);
          SQLiteDataFile((path *)&local_128,(path *)&local_150);
          bVar6 = IsSQLiteFile((path *)&local_128);
          std::filesystem::__cxx11::path::~path(&local_128);
          std::filesystem::__cxx11::path::~path(&local_150);
          std::filesystem::__cxx11::path::~path(&local_1a0);
          if (bVar6) {
            std::
            vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
            ::emplace_back<fs::path_const&,char_const(&)[7]>
                      ((vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
                        *)__return_storage_ptr__,(path *)&path.super_path,(char (*) [7])"sqlite");
          }
          goto LAB_001483b3;
        }
LAB_00147f40:
        std::
        vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
        ::emplace_back<fs::path_const&,char_const(&)[4]>
                  ((vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
                    *)__return_storage_ptr__,(path *)&path.super_path,(char (*) [4])0x4ab005);
      }
      else {
        iVar7 = std::filesystem::__cxx11::recursive_directory_iterator::depth();
        if (iVar7 == 0) {
          ppVar9 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
          cVar5 = std::filesystem::symlink_status(ppVar9);
          if (cVar5 == '\x01') {
            std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
            auVar12 = std::filesystem::__cxx11::path::_M_find_extension();
            if (auVar12._8_8_ == 0xffffffffffffffff ||
                auVar12._0_8_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::filesystem::__cxx11::path::path(&local_128);
            }
            else {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_58,auVar12._0_8_,auVar12._8_8_,0xffffffffffffffff);
              std::filesystem::__cxx11::path::path(&local_128,&local_58,auto_format);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
            }
            std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                      (&local_150,(char (*) [5])0x4963b0,auto_format);
            iVar7 = std::filesystem::__cxx11::path::compare(&local_128);
            std::filesystem::__cxx11::path::~path(&local_150);
            std::filesystem::__cxx11::path::~path(&local_128);
            if (iVar7 != 0) {
              ppVar9 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                                         (&it);
              sVar2 = (ppVar9->_M_pathname)._M_string_length;
              if (sVar2 == 0) {
LAB_0014820d:
                std::filesystem::__cxx11::path::path(&local_128);
              }
              else {
                _Var3._M_head_impl =
                     (ppVar9->_M_cmpts)._M_impl._M_t.
                     super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                     .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                     _M_head_impl;
                uVar8 = (uint)_Var3._M_head_impl;
                if ((~(byte)_Var3._M_head_impl & 3) != 0) {
                  if ((((ulong)_Var3._M_head_impl & 3) == 0) &&
                     ((ppVar9->_M_pathname)._M_dataplus._M_p[sVar2 - 1] != '/')) {
                    if (((ulong)_Var3._M_head_impl & 3) == 0) {
                      lVar11 = std::filesystem::__cxx11::path::_List::end();
                      if (((ulong)(ppVar9->_M_cmpts)._M_impl._M_t.
                                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  .
                                  super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                  ._M_head_impl & 3) == 0) {
                        ppVar9 = (path *)(lVar11 + -0x30);
                      }
                      uVar8 = (uint)(ppVar9->_M_cmpts)._M_impl._M_t.
                                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                    .
                                    super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                    ._M_head_impl;
                    }
                    if ((~uVar8 & 3) == 0) goto LAB_00148200;
                  }
                  goto LAB_0014820d;
                }
LAB_00148200:
                std::filesystem::__cxx11::path::path(&local_128,ppVar9);
              }
              std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
                        (&local_150,(char (*) [11])"wallet.dat",auto_format);
              iVar7 = std::filesystem::__cxx11::path::compare(&local_128);
              std::filesystem::__cxx11::path::~path(&local_150);
              std::filesystem::__cxx11::path::~path(&local_128);
              if (iVar7 == 0) {
                ppVar9 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                                           (&it);
                std::filesystem::__cxx11::path::path(&local_1c8,ppVar9);
                std::filesystem::__cxx11::path::path(&local_128,&local_1c8);
                bVar6 = IsBDBFile((path *)&local_128);
                std::filesystem::__cxx11::path::~path(&local_128);
                std::filesystem::__cxx11::path::~path(&local_1c8);
                if (bVar6) {
                  local_128._M_pathname.field_2._M_allocated_capacity = 0;
                  local_128._M_pathname.field_2._8_8_ = 0;
                  local_128._M_pathname._M_dataplus._M_p = (pointer)0x0;
                  local_128._M_pathname._M_string_length = 0;
                  local_128._M_cmpts._M_impl._M_t.
                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                  _M_head_impl = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
                                    )0x0;
                  std::filesystem::__cxx11::path::path(&local_128);
                  std::
                  vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
                  ::emplace_back<fs::path,char_const(&)[4]>
                            ((vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
                              *)__return_storage_ptr__,(path *)&local_128,(char (*) [4])0x4ab005);
                }
                else {
                  ppVar9 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                                             (&it);
                  std::filesystem::__cxx11::path::path(&local_1f0,ppVar9);
                  std::filesystem::__cxx11::path::path(&local_128,&local_1f0);
                  bVar6 = IsSQLiteFile((path *)&local_128);
                  std::filesystem::__cxx11::path::~path(&local_128);
                  std::filesystem::__cxx11::path::~path(&local_1f0);
                  if (!bVar6) goto LAB_001483b3;
                  local_128._M_pathname.field_2._M_allocated_capacity = 0;
                  local_128._M_pathname.field_2._8_8_ = 0;
                  local_128._M_pathname._M_dataplus._M_p = (pointer)0x0;
                  local_128._M_pathname._M_string_length = 0;
                  local_128._M_cmpts._M_impl._M_t.
                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                  _M_head_impl = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
                                    )0x0;
                  std::filesystem::__cxx11::path::path(&local_128);
                  std::
                  vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
                  ::emplace_back<fs::path,char_const(&)[7]>
                            ((vector<std::pair<fs::path,std::__cxx11::string>,std::allocator<std::pair<fs::path,std::__cxx11::string>>>
                              *)__return_storage_ptr__,(path *)&local_128,(char (*) [7])"sqlite");
                }
                std::filesystem::__cxx11::path::~path(&local_128);
              }
              else {
                ppVar9 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                                           (&it);
                std::filesystem::__cxx11::path::path(&local_218,ppVar9);
                std::filesystem::__cxx11::path::path(&local_128,&local_218);
                bVar6 = IsBDBFile((path *)&local_128);
                std::filesystem::__cxx11::path::~path(&local_128);
                std::filesystem::__cxx11::path::~path(&local_218);
                if (bVar6) goto LAB_00147f40;
              }
            }
          }
        }
      }
LAB_001483b3:
      std::filesystem::__cxx11::path::~path(&path.super_path);
    }
    else {
      ppVar9 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
      cVar5 = std::filesystem::status(ppVar9);
      ppVar9 = &local_b0;
      level = (Level)&local_128;
      if (cVar5 == '\x02') {
        std::filesystem::__cxx11::recursive_directory_iterator::disable_recursion_pending();
        (**(code **)(*(long *)ec._M_cat + 0x20))(&local_128,ec._M_cat,ec._M_value);
        ppVar10 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
        std::filesystem::__cxx11::path::path(ppVar9,ppVar10);
        std::filesystem::__cxx11::path::path(&path.super_path,ppVar9);
        local_150._M_pathname._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,path.super_path._M_pathname._M_dataplus._M_p,
                   path.super_path._M_pathname._M_dataplus._M_p +
                   path.super_path._M_pathname._M_string_length);
        logging_function._M_str = "ListDatabases";
        logging_function._M_len = 0xd;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/db.cpp"
        ;
        source_file._M_len = 0x56;
        LogPrintf_<char[14],std::__cxx11::string,std::__cxx11::string>
                  (logging_function,source_file,0x20,
                   I2P|QT|MEMPOOLREJ|RAND|REINDEX|ADDRMAN|RPC|ZMQ|MEMPOOL|NET,level,
                   (char *)&local_150,in_stack_fffffffffffffd88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_150._M_pathname._M_dataplus._M_p,
                          local_150._M_pathname.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        (**(code **)(*(long *)ec._M_cat + 0x20))(&local_128,ec._M_cat,ec._M_value);
        ppVar10 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
        ppVar9 = &local_d8;
        std::filesystem::__cxx11::path::path(ppVar9,ppVar10);
        std::filesystem::__cxx11::path::path(&path.super_path,ppVar9);
        local_150._M_pathname._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,path.super_path._M_pathname._M_dataplus._M_p,
                   path.super_path._M_pathname._M_dataplus._M_p +
                   path.super_path._M_pathname._M_string_length);
        logging_function_00._M_str = "ListDatabases";
        logging_function_00._M_len = 0xd;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/db.cpp"
        ;
        source_file_00._M_len = 0x56;
        LogPrintf_<char[14],std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,0x22,
                   I2P|QT|MEMPOOLREJ|RAND|REINDEX|ADDRMAN|RPC|ZMQ|BENCH|HTTP|MEMPOOL|NET,level,
                   (char *)&local_150,in_stack_fffffffffffffd88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_150._M_pathname._M_dataplus._M_p,
                          local_150._M_pathname.field_2._M_allocated_capacity + 1);
        }
      }
      std::filesystem::__cxx11::path::~path(&path.super_path);
      std::filesystem::__cxx11::path::~path(ppVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_pathname._M_dataplus._M_p != &local_128._M_pathname.field_2) {
        operator_delete(local_128._M_pathname._M_dataplus._M_p,
                        local_128._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    std::filesystem::__cxx11::recursive_directory_iterator::increment((error_code *)&it);
  } while( true );
}

Assistant:

std::vector<std::pair<fs::path, std::string>> ListDatabases(const fs::path& wallet_dir)
{
    std::vector<std::pair<fs::path, std::string>> paths;
    std::error_code ec;

    for (auto it = fs::recursive_directory_iterator(wallet_dir, ec); it != fs::recursive_directory_iterator(); it.increment(ec)) {
        if (ec) {
            if (fs::is_directory(*it)) {
                it.disable_recursion_pending();
                LogPrintf("%s: %s %s -- skipping.\n", __func__, ec.message(), fs::PathToString(it->path()));
            } else {
                LogPrintf("%s: %s %s\n", __func__, ec.message(), fs::PathToString(it->path()));
            }
            continue;
        }

        try {
            const fs::path path{it->path().lexically_relative(wallet_dir)};

            if (it->status().type() == fs::file_type::directory) {
                if (IsBDBFile(BDBDataFile(it->path()))) {
                    // Found a directory which contains wallet.dat btree file, add it as a wallet with BERKELEY format.
                    paths.emplace_back(path, "bdb");
                } else if (IsSQLiteFile(SQLiteDataFile(it->path()))) {
                    // Found a directory which contains wallet.dat sqlite file, add it as a wallet with SQLITE format.
                    paths.emplace_back(path, "sqlite");
                }
            } else if (it.depth() == 0 && it->symlink_status().type() == fs::file_type::regular && it->path().extension() != ".bak") {
                if (it->path().filename() == "wallet.dat") {
                    // Found top-level wallet.dat file, add top level directory ""
                    // as a wallet.
                    if (IsBDBFile(it->path())) {
                        paths.emplace_back(fs::path(), "bdb");
                    } else if (IsSQLiteFile(it->path())) {
                        paths.emplace_back(fs::path(), "sqlite");
                    }
                } else if (IsBDBFile(it->path())) {
                    // Found top-level btree file not called wallet.dat. Current bitcoin
                    // software will never create these files but will allow them to be
                    // opened in a shared database environment for backwards compatibility.
                    // Add it to the list of available wallets.
                    paths.emplace_back(path, "bdb");
                }
            }
        } catch (const std::exception& e) {
            LogPrintf("%s: Error scanning %s: %s\n", __func__, fs::PathToString(it->path()), e.what());
            it.disable_recursion_pending();
        }
    }

    return paths;
}